

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearList.cpp
# Opt level: O2

void printout(LinearList *L)

{
  ostream *this;
  char *pcVar1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < L->Last; lVar2 = lVar2 + 1) {
    pcVar1 = " ";
    if (lVar2 == 0) {
      pcVar1 = "";
    }
    this = std::operator<<((ostream *)&std::cout,pcVar1);
    std::ostream::operator<<(this,L->data[lVar2]);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void printout(LinearList *L)  //打印线性表的表目
{
    int i;
    for(i = 0; i < L->Last; i++)
        cout << (i==0?"":" ") << L->data[i];
    cout << endl;
}